

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::SSLClient::verify_host_with_subject_alt_name(SSLClient *this,X509 *server_cert)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GENERAL_NAMES *a;
  int *piVar6;
  char *pattern;
  int i;
  int iVar7;
  size_t __n;
  undefined1 local_68 [8];
  in6_addr addr6;
  undefined1 local_34 [8];
  in_addr addr;
  
  iVar3 = inet_pton(10,(this->super_ClientImpl).host_._M_dataplus._M_p,local_68);
  if (iVar3 == 0) {
    iVar3 = inet_pton(2,(this->super_ClientImpl).host_._M_dataplus._M_p,local_34);
    __n = (size_t)((uint)(iVar3 != 0) * 4);
    iVar3 = (uint)(iVar3 != 0) * 5 + 2;
  }
  else {
    iVar3 = 7;
    __n = 0x10;
  }
  iVar7 = 0;
  a = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if (a == (GENERAL_NAMES *)0x0) {
    bVar1 = false;
  }
  else {
    addr6.__in6_u._8_8_ = this;
    iVar4 = OPENSSL_sk_num(a);
    bVar2 = 0;
    bVar1 = false;
    while ((iVar7 < iVar4 && (bVar1 == false))) {
      piVar6 = (int *)OPENSSL_sk_value(a,iVar7);
      if (*piVar6 == iVar3) {
        pattern = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar6 + 2));
        iVar5 = ASN1_STRING_length(*(ASN1_STRING **)(piVar6 + 2));
        if (iVar3 == 7) {
          iVar5 = bcmp(local_68,pattern,__n);
          if (iVar5 != 0) {
            iVar5 = bcmp(local_34,pattern,__n);
            if (iVar5 != 0) goto LAB_0018f9f2;
          }
          bVar2 = 1;
          goto LAB_0018f9f2;
        }
        if (iVar3 != 2) goto LAB_0018f9f2;
        bVar1 = check_host_name((SSLClient *)addr6.__in6_u._8_8_,pattern,(long)iVar5);
      }
      else {
LAB_0018f9f2:
        bVar1 = false;
      }
      iVar7 = iVar7 + 1;
    }
    bVar1 = (bool)(bVar1 | bVar2);
  }
  GENERAL_NAMES_free(a);
  return bVar1;
}

Assistant:

inline bool
        SSLClient::verify_host_with_subject_alt_name(X509 * server_cert) const {
        auto ret = false;

        auto type = GEN_DNS;

        struct in6_addr addr6;
        struct in_addr addr;
        size_t addr_len = 0;

    #ifndef __MINGW32__
        if (inet_pton(AF_INET6, host_.c_str(), &addr6)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in6_addr);
        } else if (inet_pton(AF_INET, host_.c_str(), &addr)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in_addr);
        }
    #endif

        auto alt_names = static_cast<const struct stack_st_GENERAL_NAME*>(
            X509_get_ext_d2i(server_cert, NID_subject_alt_name, nullptr, nullptr));

        if (alt_names) {
            auto dsn_matched = false;
            auto ip_mached = false;

            auto count = sk_GENERAL_NAME_num(alt_names);

            for (decltype(count) i = 0; i < count && !dsn_matched; i++) {
                auto val = sk_GENERAL_NAME_value(alt_names, i);
                if (val->type == type) {
                    auto name = (const char*)ASN1_STRING_get0_data(val->d.ia5);
                    auto name_len = (size_t)ASN1_STRING_length(val->d.ia5);

                    switch (type) {
                        case GEN_DNS: dsn_matched = check_host_name(name, name_len); break;

                        case GEN_IPADD:
                            if (!memcmp(&addr6, name, addr_len) ||
                                !memcmp(&addr, name, addr_len)) {
                                ip_mached = true;
                            }
                            break;
                    }
                }
            }

            if (dsn_matched || ip_mached) { ret = true; }
        }

        GENERAL_NAMES_free((STACK_OF(GENERAL_NAME)*)alt_names);
        return ret;
    }